

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_Configure
                  (PaAlsaStream *self,PaStreamParameters *inParams,PaStreamParameters *outParams,
                  double sampleRate,unsigned_long framesPerUserBuffer,double *inputLatency,
                  double *outputLatency,PaUtilHostBufferSizeMode *hostBufferSizeMode)

{
  snd_pcm_t *psVar1;
  snd_pcm_t *psVar2;
  snd_pcm_uframes_t sVar3;
  double *latency;
  snd_pcm_uframes_t params;
  int iVar4;
  size_t sVar5;
  snd_pcm_hw_params_t *hwParams;
  PaStreamParameters *pPVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  PaError PVar11;
  PaStreamParameters *params_00;
  unsigned_long frames;
  char *pcVar12;
  PaAlsaStreamComponent *pPVar13;
  PaAlsaStreamComponent *pPVar14;
  PaStreamParameters *params_01;
  snd_pcm_uframes_t *psVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  void *pvStack_f0;
  ulong local_e0;
  snd_pcm_uframes_t minPlayback;
  snd_pcm_uframes_t maxCapture;
  snd_pcm_uframes_t maxPlayback;
  snd_pcm_uframes_t maxBufferSizeCapture;
  snd_pcm_uframes_t maxBufferSizePlayback;
  double *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  snd_pcm_uframes_t minCapture;
  PaStreamParameters *local_98;
  ulong local_90;
  snd_pcm_uframes_t *local_88;
  undefined8 uStack_80;
  snd_pcm_uframes_t *local_78;
  double realSr;
  ulong uStack_68;
  int accurate;
  PaStreamParameters *local_60;
  PaAlsaStreamComponent *local_58;
  undefined4 local_4c;
  PaStreamParameters *pPStack_48;
  int dir;
  PaAlsaStreamComponent *local_40;
  PaError local_34;
  
  pvStack_f0 = (void *)0x11077b;
  maxBufferSizePlayback = (snd_pcm_uframes_t)inputLatency;
  local_b0 = outputLatency;
  minCapture = (snd_pcm_uframes_t)inParams;
  local_78 = (snd_pcm_uframes_t *)sampleRate;
  sVar5 = snd_pcm_hw_params_sizeof();
  lVar8 = -(sVar5 + 0xf & 0xfffffffffffffff0);
  pPVar6 = (PaStreamParameters *)(&stack0xffffffffffffff18 + lVar8);
  *(undefined8 *)((long)&pvStack_f0 + lVar8) = 0x110799;
  memset(pPVar6,0,sVar5);
  *(undefined8 *)((long)&pvStack_f0 + lVar8) = 0x11079e;
  sVar5 = snd_pcm_hw_params_sizeof();
  hwParams = (snd_pcm_hw_params_t *)(sVar5 + 0xf & 0xfffffffffffffff0);
  params_01 = (PaStreamParameters *)((long)pPVar6 - (long)hwParams);
  params_01[-1].hostApiSpecificStreamInfo = (void *)0x1107bc;
  memset(params_01,0,sVar5);
  pPVar13 = &self->capture;
  local_40 = pPVar13;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    params_01[-1].hostApiSpecificStreamInfo = (void *)0x1107e1;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (pPVar13,pPVar6,(int)&local_78,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar12 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2714\n"
      ;
      goto LAB_0011114b;
    }
  }
  pPVar13 = &self->playback;
  local_60 = pPVar6;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    params_01[-1].hostApiSpecificStreamInfo = (void *)0x110817;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (pPVar13,params_01,(int)&local_78,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar12 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2717\n"
      ;
      goto LAB_0011114b;
    }
  }
  pPVar14 = local_40;
  pPVar6 = local_60;
  psVar15 = local_78;
  sVar3 = minCapture;
  local_4c = 0;
  realSr._4_4_ = 1;
  psVar1 = (self->playback).pcm;
  if ((self->capture).pcm == (snd_pcm_t *)0x0) {
    if (psVar1 == (snd_pcm_t *)0x0) {
      params_01[-1].hostApiSpecificStreamInfo = PaAlsaStream_Terminate;
      __assert_fail("self->playback.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xa73,
                    "PaError PaAlsaStream_DetermineFramesPerBuffer(PaAlsaStream *, double, const PaStreamParameters *, const PaStreamParameters *, unsigned long, snd_pcm_hw_params_t *, snd_pcm_hw_params_t *, PaUtilHostBufferSizeMode *)"
                   );
    }
    params_01[-1].hostApiSpecificStreamInfo = (void *)0x1109ad;
    paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                           (pPVar13,outParams,framesPerUserBuffer,(double)psVar15,
                            (snd_pcm_hw_params_t *)params_01,(int *)((long)&realSr + 4));
    lVar8 = 0x348;
    if (-1 < paUtilErr_) goto LAB_001109f2;
    pcVar12 = 
    "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->playback, outputParameters, framesPerUserBuffer, sampleRate, hwParamsPlayback, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2677\n"
    ;
LAB_0011117c:
    params_01[-1].hostApiSpecificStreamInfo = (void *)0x111183;
    PaUtil_DebugPrint(pcVar12);
    PVar11 = paUtilErr_;
  }
  else {
    if (psVar1 == (snd_pcm_t *)0x0) {
      params_01[-1].hostApiSpecificStreamInfo = (void *)0x1109df;
      paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                             (pPVar14,(PaStreamParameters *)sVar3,framesPerUserBuffer,
                              (double)psVar15,(snd_pcm_hw_params_t *)pPVar6,
                              (int *)((long)&realSr + 4));
      lVar8 = 0x2c8;
      if (paUtilErr_ < 0) {
        pcVar12 = 
        "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->capture, inputParameters, framesPerUserBuffer, sampleRate, hwParamsCapture, &accurate)\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2670\n"
        ;
        goto LAB_0011117c;
      }
LAB_001109f2:
      uVar10 = *(ulong *)((long)&(self->streamRepresentation).magic + lVar8);
      PVar11 = 0;
    }
    else {
      local_88 = local_78;
      uStack_80 = 0;
      local_98 = (PaStreamParameters *)(ulong)(uint)numPeriods_;
      pPStack_48 = outParams;
      if (framesPerUserBuffer == 0) {
        local_4c = 0;
        params_01[-1].hostApiSpecificStreamInfo = (void *)0x110a61;
        iVar4 = snd_pcm_hw_params_get_period_size_min(pPVar6,&local_a8);
        if (iVar4 < 0) {
          params_01[-1].hostApiSpecificStreamInfo = (void *)0x1111d6;
          PaAlsaStream_Configure_cold_3();
          PVar11 = -9999;
LAB_00110c37:
          uVar10 = 0;
          bVar16 = true;
          outParams = pPStack_48;
        }
        else {
          local_34 = 0;
          local_4c = 0;
          params_01[-1].hostApiSpecificStreamInfo = (void *)0x110a9b;
          iVar4 = snd_pcm_hw_params_get_period_size_min(params_01,&stack0xffffffffffffff20);
          pPVar6 = local_60;
          if (iVar4 < 0) {
            params_01[-1].hostApiSpecificStreamInfo = (void *)0x1111ed;
            PaAlsaStream_Configure_cold_4();
LAB_00110c46:
            local_34 = -9999;
            bVar16 = true;
            uVar10 = 0;
            outParams = pPStack_48;
            PVar11 = local_34;
          }
          else {
            uStack_68 = 0;
            local_4c = 0;
            params_01[-1].hostApiSpecificStreamInfo = (void *)0x110ad1;
            iVar4 = snd_pcm_hw_params_get_period_size_max(pPVar6,&minPlayback);
            if (iVar4 < 0) {
              params_01[-1].hostApiSpecificStreamInfo = (void *)0x111207;
              PaAlsaStream_Configure_cold_5();
LAB_00110c5a:
              local_34 = -9999;
              uStack_68 = 4;
              uVar10 = 0;
              bVar16 = true;
              outParams = pPStack_48;
              PVar11 = local_34;
            }
            else {
              local_4c = 0;
              params_01[-1].hostApiSpecificStreamInfo = (void *)0x110b01;
              iVar4 = snd_pcm_hw_params_get_period_size_max(params_01,&maxCapture);
              outParams = pPStack_48;
              pPVar6 = local_60;
              if (iVar4 < 0) {
                params_01[-1].hostApiSpecificStreamInfo = (void *)0x111224;
                PaAlsaStream_Configure_cold_6();
LAB_00110f0f:
                bVar16 = true;
                local_34 = -9999;
                uVar10 = 0;
                outParams = pPStack_48;
                PVar11 = local_34;
              }
              else {
                local_90 = CONCAT44(uStack_a4,local_a8);
                if (CONCAT44(uStack_a4,local_a8) < local_e0) {
                  local_90 = local_e0;
                }
                if (maxCapture < minPlayback) {
                  minPlayback = maxCapture;
                }
                uStack_68 = minPlayback;
                if (minPlayback < local_90) {
                  local_58 = pPVar13;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x111247;
                  PaUtil_DebugPrint(
                                   "Expression \'minPeriodSize <= maxPeriodSize\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2540\n"
                                   );
                  PVar11 = -0x2709;
                  pPVar13 = local_58;
                  goto LAB_00110c37;
                }
                dVar17 = pPStack_48->suggestedLatency;
                if (*(double *)(minCapture + 0x10) <= pPStack_48->suggestedLatency) {
                  dVar17 = *(double *)(minCapture + 0x10);
                }
                dVar17 = (double)local_88 * dVar17;
                uVar10 = (ulong)dVar17;
                local_58 = pPVar13;
                params_01[-1].hostApiSpecificStreamInfo = (void *)0x110ba9;
                iVar4 = snd_pcm_hw_params_get_buffer_size_max(pPVar6,&maxPlayback);
                bVar16 = iVar4 < 0;
                if (bVar16) {
                  local_88 = (snd_pcm_uframes_t *)CONCAT44(local_88._4_4_,iVar4);
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x111269;
                  PaAlsaStream_Configure_cold_7();
                  local_34 = -9999;
                  iVar4 = (int)local_88;
                }
                psVar15 = (snd_pcm_uframes_t *)
                          (uVar10 | (long)(dVar17 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f);
                pPVar13 = local_58;
                if (-1 < iVar4) {
                  local_88 = psVar15;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x110bd1;
                  iVar4 = snd_pcm_hw_params_get_buffer_size_max(params_01,&maxBufferSizeCapture);
                  pPVar13 = local_58;
                  if (iVar4 < 0) {
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x111285;
                    PaAlsaStream_Configure_cold_8();
                    local_34 = -9999;
                    bVar16 = true;
                    psVar15 = local_88;
                  }
                  else {
                    if (maxPlayback < maxBufferSizeCapture) {
                      maxBufferSizeCapture = maxPlayback;
                    }
                    psVar15 = local_88;
                    if (maxBufferSizeCapture < local_88) {
                      psVar15 = (snd_pcm_uframes_t *)maxBufferSizeCapture;
                    }
                    bVar16 = false;
                  }
                }
                if (bVar16) {
                  uVar10 = 0;
                  PVar11 = local_34;
                }
                else {
                  auVar18._8_4_ = (int)(local_90 >> 0x20);
                  auVar18._0_8_ = local_90;
                  auVar18._12_4_ = 0x45300000;
                  local_88 = psVar15;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x110cbb;
                  iVar4 = ilogb((auVar18._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0));
                  lVar8 = ((long)iVar4 + 1) - (ulong)((local_90 - 1 & local_90) == 0);
                  auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
                  auVar19._0_8_ = lVar8;
                  auVar19._12_4_ = 0x45300000;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x110cf2;
                  dVar17 = exp2((auVar19._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
                  pPVar6 = local_60;
                  uVar10 = (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f |
                           (long)dVar17;
                  if (uVar10 <= uStack_68) {
                    do {
                      psVar1 = (self->playback).pcm;
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x110d2f;
                      iVar4 = snd_pcm_hw_params_test_period_size(psVar1,params_01,uVar10,0);
                      if (-1 < iVar4) {
                        psVar1 = (self->capture).pcm;
                        params_01[-1].hostApiSpecificStreamInfo = (void *)0x110d47;
                        iVar4 = snd_pcm_hw_params_test_period_size(psVar1,pPVar6,uVar10,0);
                        if (-1 < iVar4) break;
                      }
                      uVar10 = uVar10 * 2;
                    } while (uVar10 <= uStack_68);
                  }
                  if (local_90 < (ulong)local_88 / (ulong)local_98) {
                    local_90 = (ulong)local_88 / (ulong)local_98;
                  }
                  uVar7 = local_90;
                  if (uStack_68 <= local_90) {
                    uVar7 = uStack_68;
                  }
                  auVar20._8_4_ = (int)(uVar7 >> 0x20);
                  auVar20._0_8_ = uVar7;
                  auVar20._12_4_ = 0x45300000;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x110da1;
                  iVar4 = ilogb((auVar20._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
                  lVar8 = ((long)iVar4 + 1) - (ulong)((uVar7 - 1 & uVar7) == 0);
                  auVar21._8_4_ = (int)((ulong)lVar8 >> 0x20);
                  auVar21._0_8_ = lVar8;
                  auVar21._12_4_ = 0x45300000;
                  local_90 = uVar7;
                  params_01[-1].hostApiSpecificStreamInfo = (void *)0x110ddf;
                  dVar17 = exp2((auVar21._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
                  pPVar13 = local_58;
                  pPVar6 = local_60;
                  for (uVar7 = (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f |
                               (long)dVar17; local_60 = pPVar6, uVar10 <= uVar7; uVar7 = uVar7 >> 1)
                  {
                    psVar1 = (self->capture).pcm;
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x110e22;
                    iVar4 = snd_pcm_hw_params_test_period_size(psVar1,pPVar6,uVar7);
                    if (-1 < iVar4) {
                      psVar1 = (self->playback).pcm;
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x110e3a;
                      iVar4 = snd_pcm_hw_params_test_period_size(psVar1,params_01,uVar7);
                      if (-1 < iVar4) break;
                    }
                    pPVar6 = local_60;
                  }
                  pPVar6 = local_60;
                  if (uVar10 < uVar7) {
                    uVar10 = uVar7;
                  }
                  if (uStack_68 < uVar10) {
                    local_58 = (PaAlsaStreamComponent *)&(self->capture).framesPerPeriod;
                    (self->capture).framesPerPeriod = local_90;
                    local_4c = 0;
                    psVar1 = (self->capture).pcm;
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x110e8a;
                    iVar4 = snd_pcm_hw_params_set_period_size_near(psVar1,pPVar6);
                    if (iVar4 < 0) {
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x11129e;
                      PaAlsaStream_Configure_cold_11();
                      goto LAB_00110c46;
                    }
                    local_88 = &(self->playback).framesPerPeriod;
                    (self->playback).framesPerPeriod = local_90;
                    local_4c = 0;
                    psVar1 = (self->playback).pcm;
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x110ed5;
                    iVar4 = snd_pcm_hw_params_set_period_size_near(psVar1,params_01);
                    if (iVar4 < 0) {
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x1112d4;
                      PaAlsaStream_Configure_cold_12();
                      goto LAB_00110f0f;
                    }
                    uVar10 = *local_88;
                    if (*local_88 < local_58->hostSampleFormat) {
                      uVar10 = local_58->hostSampleFormat;
                    }
                    *hostBufferSizeMode = paUtilBoundedHostBufferSize;
                    bVar16 = false;
                    outParams = pPStack_48;
                    PVar11 = local_34;
                  }
                  else {
                    psVar1 = (self->capture).pcm;
                    uStack_68 = 0;
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x111091;
                    iVar4 = snd_pcm_hw_params_set_period_size(psVar1,pPVar6,uVar10);
                    if (iVar4 < 0) {
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x1112b7;
                      PaAlsaStream_Configure_cold_9();
                      pPVar13 = local_58;
                      goto LAB_00110c5a;
                    }
                    psVar1 = (self->playback).pcm;
                    params_01[-1].hostApiSpecificStreamInfo = (void *)0x1110b8;
                    iVar4 = snd_pcm_hw_params_set_period_size(psVar1,params_01,uVar10);
                    bVar16 = iVar4 < 0;
                    if (bVar16) {
                      params_01[-1].hostApiSpecificStreamInfo = (void *)0x1112ee;
                      PaAlsaStream_Configure_cold_10();
                      local_34 = -9999;
                      uVar10 = 0;
                      pPVar13 = local_58;
                      outParams = pPStack_48;
                      PVar11 = local_34;
                    }
                    else {
                      (self->playback).framesPerPeriod = uVar10;
                      (self->capture).framesPerPeriod = uVar10;
                      pPVar13 = local_58;
                      outParams = pPStack_48;
                      PVar11 = local_34;
                    }
                  }
                }
              }
            }
          }
        }
        if (bVar16) goto LAB_00110f21;
      }
      else {
        local_a8 = 0;
        local_4c = 0;
        local_58 = pPVar13;
        params_01[-1].hostApiSpecificStreamInfo = (void *)0x110899;
        iVar4 = snd_pcm_hw_params_get_periods_max(params_01);
        psVar15 = local_88;
        bVar16 = iVar4 < 0;
        if (bVar16) {
          params_01[-1].hostApiSpecificStreamInfo = (void *)0x111165;
          PaAlsaStream_Configure_cold_1();
          PVar11 = -9999;
LAB_00110c19:
          uVar10 = 0;
        }
        else {
          uVar9 = (uint)local_98;
          pPVar6 = local_60;
          params_00 = (PaStreamParameters *)minCapture;
          local_98 = params_01;
          pPVar13 = local_58;
          pPVar14 = local_40;
          if (local_a8 < uVar9) {
            pPVar6 = params_01;
            params_00 = pPStack_48;
            local_98 = local_60;
            pPVar13 = local_40;
            pPVar14 = local_58;
          }
          local_34 = 0;
          params_01[-1].hostApiSpecificStreamInfo = (void *)0x11090a;
          paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                                 (pPVar14,params_00,framesPerUserBuffer,(double)psVar15,
                                  (snd_pcm_hw_params_t *)pPVar6,(int *)((long)&realSr + 4));
          pPVar6 = local_98;
          if (paUtilErr_ < 0) {
            params_01[-1].hostApiSpecificStreamInfo = (void *)0x1111a3;
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( first, firstStreamParams, framesPerUserBuffer, sampleRate, firstHwParams, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2648\n"
                             );
            bVar16 = true;
            PVar11 = paUtilErr_;
            goto LAB_00110c19;
          }
          pPVar13->framesPerPeriod = pPVar14->framesPerPeriod;
          local_4c = 0;
          psVar1 = pPVar13->pcm;
          params_01[-1].hostApiSpecificStreamInfo = (void *)0x110941;
          iVar4 = snd_pcm_hw_params_set_period_size_near(psVar1,pPVar6,&pPVar13->framesPerPeriod);
          bVar16 = iVar4 < 0;
          if (bVar16) {
            params_01[-1].hostApiSpecificStreamInfo = (void *)0x1111bc;
            PaAlsaStream_Configure_cold_2();
            local_34 = -9999;
            PVar11 = local_34;
            goto LAB_00110c19;
          }
          uVar10 = (self->capture).framesPerPeriod;
          uVar7 = (self->playback).framesPerPeriod;
          if (uVar10 != uVar7) {
            if (uVar10 <= uVar7) {
              uVar10 = uVar7;
            }
            *hostBufferSizeMode = paUtilBoundedHostBufferSize;
          }
          bVar16 = false;
          PVar11 = local_34;
        }
        pPVar13 = local_58;
        outParams = pPStack_48;
        if (bVar16) goto LAB_00110f21;
      }
    }
    if (uVar10 == 0) {
      params_01[-1].hostApiSpecificStreamInfo = (void *)0x11111b;
      PaUtil_DebugPrint(
                       "Expression \'framesPerHostBuffer != 0\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2682\n"
                       );
      PVar11 = -0x2702;
    }
    else {
      self->maxFramesPerHostBuffer = uVar10;
      if (((self->playback).canMmap == 0 || realSr._4_4_ == 0) &&
         (*hostBufferSizeMode = paUtilBoundedHostBufferSize, realSr._4_4_ == 0)) {
        self->maxFramesPerHostBuffer = uVar10 + 1;
      }
    }
  }
LAB_00110f21:
  paUtilErr_ = PVar11;
  pPVar14 = local_40;
  pPVar6 = local_60;
  psVar15 = local_78;
  params = minCapture;
  sVar3 = maxBufferSizePlayback;
  if (-1 < paUtilErr_) {
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      if ((self->capture).framesPerPeriod == 0) {
        params_01[-1].hostApiSpecificStreamInfo = (void *)0x11131f;
        __assert_fail("self->capture.framesPerPeriod != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xaa4,
                      "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                     );
      }
      iVar4 = self->primeBuffers;
      params_01[-1].hostApiSpecificStreamInfo = (void *)0x110f69;
      paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                             (pPVar14,(snd_pcm_hw_params_t *)pPVar6,(PaStreamParameters *)params,
                              iVar4,(double)psVar15,(PaTime *)sVar3);
      if (paUtilErr_ < 0) {
        pcVar12 = 
        "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr, inputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2726\n"
        ;
        goto LAB_0011114b;
      }
    }
    psVar15 = local_78;
    latency = local_b0;
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      if ((self->playback).framesPerPeriod == 0) {
        params_01[-1].hostApiSpecificStreamInfo = (void *)0x11133e;
        __assert_fail("self->playback.framesPerPeriod != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xaab,
                      "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                     );
      }
      iVar4 = self->primeBuffers;
      params_01[-1].hostApiSpecificStreamInfo = (void *)0x110faf;
      paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                             (pPVar13,(snd_pcm_hw_params_t *)params_01,outParams,iVar4,
                              (double)psVar15,latency);
      if (paUtilErr_ < 0) {
        pcVar12 = 
        "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr, outputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2733\n"
        ;
        goto LAB_0011114b;
      }
    }
    (self->streamRepresentation).streamInfo.sampleRate = (double)local_78;
    if (((self->callbackMode != 0) && ((self->capture).pcm != (snd_pcm_t *)0x0)) &&
       ((self->playback).pcm != (snd_pcm_t *)0x0)) {
      params_01[-1].hostApiSpecificStreamInfo = (void *)0x110fed;
      iVar4 = snd_pcm_link();
      if (iVar4 == 0) {
        self->pcmsSynced = 1;
      }
    }
    psVar1 = (self->capture).pcm;
    uVar7 = 0xffffffffffffffff;
    uVar10 = 0xffffffffffffffff;
    if (psVar1 != (snd_pcm_t *)0x0) {
      uVar10 = (self->capture).framesPerPeriod;
    }
    psVar2 = (self->playback).pcm;
    if (psVar2 != (snd_pcm_t *)0x0) {
      uVar7 = (self->playback).framesPerPeriod;
    }
    if (uVar10 < uVar7) {
      lVar8 = 0x2c8;
    }
    else {
      lVar8 = 0x348;
      psVar1 = psVar2;
    }
    if (psVar1 == (snd_pcm_t *)0x0) {
      frames = 0xffffffffffffffff;
    }
    else {
      frames = *(unsigned_long *)((long)&(self->streamRepresentation).magic + lVar8);
    }
    params_01[-1].hostApiSpecificStreamInfo = (void *)0x11105d;
    iVar4 = CalculatePollTimeout(self,frames);
    self->pollTimeout = iVar4;
    return 0;
  }
  pcVar12 = 
  "Expression \'PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer, hwParamsCapture, hwParamsPlayback, hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2720\n"
  ;
LAB_0011114b:
  params_01[-1].hostApiSpecificStreamInfo = (void *)0x111152;
  PaUtil_DebugPrint(pcVar12);
  return paUtilErr_;
}

Assistant:

static PaError PaAlsaStream_Configure( PaAlsaStream *self, const PaStreamParameters *inParams, const PaStreamParameters*
        outParams, double sampleRate, unsigned long framesPerUserBuffer, double* inputLatency, double* outputLatency,
        PaUtilHostBufferSizeMode* hostBufferSizeMode )
{
    PaError result = paNoError;
    double realSr = sampleRate;
    snd_pcm_hw_params_t* hwParamsCapture, * hwParamsPlayback;

    alsa_snd_pcm_hw_params_alloca( &hwParamsCapture );
    alsa_snd_pcm_hw_params_alloca( &hwParamsPlayback );

    if( self->capture.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture,
                    &realSr ) );
    if( self->playback.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback,
                    &realSr ) );

    PA_ENSURE( PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer,
                hwParamsCapture, hwParamsPlayback, hostBufferSizeMode ) );

    if( self->capture.pcm )
    {
        assert( self->capture.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr,
                    inputLatency ) );
        PA_DEBUG(( "%s: Capture period size: %lu, latency: %f\n", __FUNCTION__, self->capture.framesPerPeriod, *inputLatency ));
    }
    if( self->playback.pcm )
    {
        assert( self->playback.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr,
                    outputLatency ) );
        PA_DEBUG(( "%s: Playback period size: %lu, latency: %f\n", __FUNCTION__, self->playback.framesPerPeriod, *outputLatency ));
    }

    /* Should be exact now */
    self->streamRepresentation.streamInfo.sampleRate = realSr;

    /* this will cause the two streams to automatically start/stop/prepare in sync.
     * We only need to execute these operations on one of the pair.
     * A: We don't want to do this on a blocking stream.
     */
    if( self->callbackMode && self->capture.pcm && self->playback.pcm )
    {
        int err = alsa_snd_pcm_link( self->capture.pcm, self->playback.pcm );
        if( err == 0 )
            self->pcmsSynced = 1;
        else
            PA_DEBUG(( "%s: Unable to sync pcms: %s\n", __FUNCTION__, alsa_snd_strerror( err ) ));
    }

    {
        unsigned long minFramesPerHostBuffer = PA_MIN( self->capture.pcm ? self->capture.framesPerPeriod : ULONG_MAX,
            self->playback.pcm ? self->playback.framesPerPeriod : ULONG_MAX );
        self->pollTimeout = CalculatePollTimeout( self, minFramesPerHostBuffer );    /* Period in msecs, rounded up */

        /* Time before watchdog unthrottles realtime thread == 1/4 of period time in msecs */
        /* self->threading.throttledSleepTime = (unsigned long) (minFramesPerHostBuffer / sampleRate / 4 * 1000); */
    }

    if( self->callbackMode )
    {
        /* If the user expects a certain number of frames per callback we will either have to rely on block adaption
         * (framesPerHostBuffer is not an integer multiple of framesPerPeriod) or we can simply align the number
         * of host buffer frames with what the user specified */
        if( self->framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* self->alignFrames = 1; */

            /* Unless the ratio between number of host and user buffer frames is an integer we will have to rely
             * on block adaption */
        /*
            if( framesPerHostBuffer % framesPerPeriod != 0 || (self->capture.pcm && self->playback.pcm &&
                        self->capture.framesPerPeriod != self->playback.framesPerPeriod) )
                self->useBlockAdaption = 1;
            else
                self->alignFrames = 1;
        */
        }
    }

error:
    return result;
}